

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::TransformNode> *node,ssize_t id)

{
  undefined8 *puVar1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar2;
  TransformNode *pTVar3;
  ulong uVar4;
  undefined1 *puVar5;
  long lVar6;
  undefined1 *puVar7;
  Ref<embree::SceneGraph::Node> local_108;
  Ref<embree::SceneGraph::Node> local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((node->ptr->spaces).spaces.size_active == 1) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Transform","");
    open(this,(char *)local_98,(int)id);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    pAVar2 = (node->ptr->spaces).spaces.items;
    local_78._0_8_ = *(undefined8 *)&(pAVar2->l).vx.field_0;
    local_78._8_8_ = *(undefined8 *)((long)&(pAVar2->l).vx.field_0 + 8);
    local_68 = *(undefined8 *)&(pAVar2->l).vy.field_0;
    uStack_60 = *(undefined8 *)((long)&(pAVar2->l).vy.field_0 + 8);
    local_58 = *(undefined8 *)&(pAVar2->l).vz.field_0;
    uStack_50 = *(undefined8 *)((long)&(pAVar2->l).vz.field_0 + 8);
    local_48 = *(undefined8 *)&(pAVar2->p).field_0;
    uStack_40 = *(undefined8 *)((long)&(pAVar2->p).field_0 + 8);
    store(this,"AffineSpace",(AffineSpace3fa *)&local_78.field_1);
    local_100.ptr = (node->ptr->child).ptr;
    if (local_100.ptr != (Node *)0x0) {
      (*((local_100.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_100);
    if (local_100.ptr != (Node *)0x0) {
      (*((local_100.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    puVar7 = local_a8;
    local_b8[0] = puVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Transform","");
    close(this,(int)(string *)local_b8);
    puVar5 = local_b8[0];
  }
  else {
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"TransformAnimation","");
    open(this,(char *)local_d8,(int)id);
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0]);
    }
    pTVar3 = node->ptr;
    if ((pTVar3->spaces).spaces.size_active != 0) {
      lVar6 = 0x30;
      uVar4 = 0;
      do {
        pAVar2 = (pTVar3->spaces).spaces.items;
        puVar1 = (undefined8 *)((long)pAVar2 + lVar6 + -0x30);
        local_78._0_8_ = *puVar1;
        local_78._8_8_ = puVar1[1];
        puVar1 = (undefined8 *)((long)pAVar2 + lVar6 + -0x20);
        local_68 = *puVar1;
        uStack_60 = puVar1[1];
        puVar1 = (undefined8 *)((long)pAVar2 + lVar6 + -0x10);
        local_58 = *puVar1;
        uStack_50 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pAVar2->l).vx.field_0 + lVar6);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
        store(this,"AffineSpace",(AffineSpace3fa *)&local_78.field_1);
        uVar4 = uVar4 + 1;
        pTVar3 = node->ptr;
        lVar6 = lVar6 + 0x40;
      } while (uVar4 < (pTVar3->spaces).spaces.size_active);
    }
    local_108.ptr = (pTVar3->child).ptr;
    if (local_108.ptr != (Node *)0x0) {
      (*((local_108.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_108);
    if (local_108.ptr != (Node *)0x0) {
      (*((local_108.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    puVar7 = local_e8;
    local_f8[0] = puVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"TransformAnimation","");
    close(this,(int)(string *)local_f8);
    puVar5 = local_f8[0];
  }
  if (puVar5 != puVar7) {
    operator_delete(puVar5);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::TransformNode> node, ssize_t id)
  {
    if (node->spaces.size() == 1)
    {
      open("Transform",id);
      store("AffineSpace",node->spaces[0]);
      store(node->child);
      close("Transform");
    }
    else 
    {
      open("TransformAnimation",id);
      for (size_t i=0; i<node->spaces.size(); i++)
        store("AffineSpace",node->spaces[i]);
      store(node->child);
      close("TransformAnimation");
    }
  }